

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O2

string * __thiscall helics::EndpointInfo::getDestinationTargets_abi_cxx11_(EndpointInfo *this)

{
  string *this_00;
  pointer pEVar1;
  pointer pEVar2;
  string local_50;
  
  this_00 = &this->destinationTargets;
  if ((this->destinationTargets)._M_string_length == 0) {
    pEVar2 = (this->targetInformation).
             super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pEVar1 = (this->targetInformation).
             super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pEVar2 != pEVar1) {
      if ((long)pEVar1 - (long)pEVar2 == 0x48) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (this_00,&pEVar2->key);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this_00,'[');
        pEVar1 = (this->targetInformation).
                 super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pEVar2 = (this->targetInformation).
                      super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                      ._M_impl.super__Vector_impl_data._M_start; pEVar2 != pEVar1;
            pEVar2 = pEVar2 + 1) {
          generateJsonQuotedString(&local_50,&pEVar2->key);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (this_00,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (this_00,',');
        }
        (this->destinationTargets)._M_dataplus._M_p[(this->destinationTargets)._M_string_length - 1]
             = ']';
      }
    }
  }
  return this_00;
}

Assistant:

const std::string& EndpointInfo::getDestinationTargets() const
{
    if (destinationTargets.empty()) {
        if (!targetInformation.empty()) {
            if (targetInformation.size() == 1) {
                destinationTargets = targetInformation.front().key;
            } else {
                destinationTargets.push_back('[');
                for (const auto& trgt : targetInformation) {
                    destinationTargets.append(generateJsonQuotedString(trgt.key));
                    destinationTargets.push_back(',');
                }
                destinationTargets.back() = ']';
            }
        }
    }
    return destinationTargets;
}